

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# up_xtreme.c
# Opt level: O2

mraa_board_t * mraa_upxtreme_board(void)

{
  int iVar1;
  int iVar2;
  mraa_result_t mVar3;
  mraa_board_t *board;
  mraa_pininfo_t *__ptr;
  mraa_adv_func_t *pmVar4;
  char *pcVar5;
  
  board = (mraa_board_t *)calloc(1,0x5f0);
  if (board != (mraa_board_t *)0x0) {
    board->platform_name = "UPXTREME";
    board->platform_version = "1.0.0";
    board->phy_pin_count = 0x29;
    board->gpio_count = 0x1c;
    __ptr = (mraa_pininfo_t *)malloc(0x7914);
    board->pins = __ptr;
    if (__ptr != (mraa_pininfo_t *)0x0) {
      pmVar4 = (mraa_adv_func_t *)calloc(1,0x288);
      board->adv_func = pmVar4;
      if (pmVar4 == (mraa_adv_func_t *)0x0) {
        free(__ptr);
      }
      else {
        pmVar4->aio_get_valid_fp = mraa_up_aio_get_valid_fp;
        mraa_upxtreme_set_pininfo(board,0,"INVALID",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,1,"3.3v",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,2,"5v",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,3,"I2C_SDA",(mraa_pincapabilities_t)0x23,0x170,0,0xa8);
        mraa_upxtreme_set_pininfo(board,4,"5v",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,5,"I2C_SCL",(mraa_pincapabilities_t)0x23,0x171,0,0xa9);
        mraa_upxtreme_set_pininfo(board,6,"GND",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,7,"ADC0",(mraa_pincapabilities_t)0x43,0x128,0,0x60);
        mraa_upxtreme_set_pininfo(board,8,"UART_TX",(mraa_pincapabilities_t)0x83,0x1d5,0,0x10d);
        mraa_upxtreme_set_pininfo(board,9,"GND",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,10,"UART_RX",(mraa_pincapabilities_t)0x83,0x1d4,0,0x10c);
        mraa_upxtreme_set_pininfo(board,0xb,"UART_RTS",(mraa_pincapabilities_t)0x83,0x1d6,0,0x10e);
        mraa_upxtreme_set_pininfo(board,0xc,"I2S_CLK",(mraa_pincapabilities_t)0x3,0x168,0,0xa0);
        mraa_upxtreme_set_pininfo(board,0xd,"GPIO27",(mraa_pincapabilities_t)0x3,0x10c,0,0x44);
        mraa_upxtreme_set_pininfo(board,0xe,"GND",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,0xf,"GPIO22",(mraa_pincapabilities_t)0x3,0x10e,0,0x46);
        mraa_upxtreme_set_pininfo(board,0x10,"GPIO23",(mraa_pincapabilities_t)0x3,0x108,0,0x40);
        mraa_upxtreme_set_pininfo(board,0x11,"3.3v",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,0x12,"GPIO24",(mraa_pincapabilities_t)0x3,0x109,0,0x41);
        mraa_upxtreme_set_pininfo(board,0x13,"SPI0_MOSI",(mraa_pincapabilities_t)0x13,0x134,0,0x6c);
        mraa_upxtreme_set_pininfo(board,0x14,"GND",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,0x15,"SPI0_MISO",(mraa_pincapabilities_t)0x13,0x133,0,0x6b);
        mraa_upxtreme_set_pininfo(board,0x16,"GPIO25",(mraa_pincapabilities_t)0x3,0x10a,0,0x42);
        mraa_upxtreme_set_pininfo(board,0x17,"SPI0_CLK",(mraa_pincapabilities_t)0x13,0x132,0,0x6a);
        mraa_upxtreme_set_pininfo(board,0x18,"SPI0_CS0",(mraa_pincapabilities_t)0x13,0x131,0,0x69);
        mraa_upxtreme_set_pininfo(board,0x19,"GND",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,0x1a,"SPI0_CS1",(mraa_pincapabilities_t)0x13,0x137,0,0x6f);
        mraa_upxtreme_set_pininfo(board,0x1b,"ID_SD",(mraa_pincapabilities_t)0x23,0x16e,0,0xa6);
        mraa_upxtreme_set_pininfo(board,0x1c,"ID_SC",(mraa_pincapabilities_t)0x23,0x16f,0,0xa7);
        mraa_upxtreme_set_pininfo(board,0x1d,"GPIO5",(mraa_pincapabilities_t)0x3,0x13d,0,0x75);
        mraa_upxtreme_set_pininfo(board,0x1e,"GND",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,0x1f,"GPIO6",(mraa_pincapabilities_t)0x3,0x13e,0,0x76);
        mraa_upxtreme_set_pininfo(board,0x20,"GPIO12",(mraa_pincapabilities_t)0x3,0x12a,0,0x62);
        mraa_upxtreme_set_pininfo(board,0x21,"GPIO13",(mraa_pincapabilities_t)0x3,299,0,99);
        mraa_upxtreme_set_pininfo(board,0x22,"GND",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,0x23,"I2S_FRM",(mraa_pincapabilities_t)0x3,0x169,0,0xa1);
        mraa_upxtreme_set_pininfo(board,0x24,"UART_CTS",(mraa_pincapabilities_t)0x83,0x1d7,0,0x10f);
        mraa_upxtreme_set_pininfo(board,0x25,"GPIO26",(mraa_pincapabilities_t)0x3,0x10b,0,0x43);
        mraa_upxtreme_set_pininfo(board,0x26,"I2S_DIN",(mraa_pincapabilities_t)0x3,0x16b,0,0xa3);
        mraa_upxtreme_set_pininfo(board,0x27,"GND",(mraa_pincapabilities_t)0x0,-1,-1,-1);
        mraa_upxtreme_set_pininfo(board,0x28,"I2S_DOUT",(mraa_pincapabilities_t)0x3,0x16a,0,0xa2);
        board->i2c_bus_count = 0;
        board->def_i2c_bus = 0;
        iVar2 = mraa_find_i2c_bus_pci("0000:00","0000:00:19.0","i2c_designware.3");
        if (iVar2 == -1) {
          syslog(4,"UP Xtreme: Platform failed to find I2C0 controller");
        }
        else {
          iVar1 = board->i2c_bus_count;
          board->i2c_bus[iVar1].bus_id = iVar2;
          mraa_upxtreme_get_pin_index(board,"I2C_SDA",&board->i2c_bus[iVar1].sda);
          mraa_upxtreme_get_pin_index(board,"I2C_SCL",&board->i2c_bus[iVar1].scl);
          board->i2c_bus_count = board->i2c_bus_count + 1;
        }
        iVar2 = mraa_find_i2c_bus_pci("0000:00","0000:00:15.3","i2c_designware.2");
        if (iVar2 == -1) {
          syslog(4,"UP Xtreme: Platform failed to find I2C1 controller");
        }
        else {
          iVar1 = board->i2c_bus_count;
          board->i2c_bus[iVar1].bus_id = iVar2;
          mraa_upxtreme_get_pin_index(board,"ID_SD",&board->i2c_bus[iVar1].sda);
          mraa_upxtreme_get_pin_index(board,"ID_SC",&board->i2c_bus[iVar1].scl);
          board->i2c_bus_count = board->i2c_bus_count + 1;
        }
        board->pwm_dev_count = 0;
        board->spi_bus_count = 0;
        board->def_spi_bus = 0;
        board->spi_bus[0].bus_id = 0;
        board->spi_bus[0].slave_s = 0;
        mraa_upxtreme_get_pin_index(board,"SPI0_CS0",&board->spi_bus[0].cs);
        mraa_upxtreme_get_pin_index(board,"SPI0_MOSI",&board->spi_bus[0].mosi);
        mraa_upxtreme_get_pin_index(board,"SPI0_MISO",&board->spi_bus[0].miso);
        mraa_upxtreme_get_pin_index(board,"SPI0_CLK",&board->spi_bus[0].sclk);
        board->spi_bus_count = board->spi_bus_count + 1;
        board->spi_bus[1].bus_id = 0;
        board->spi_bus[1].slave_s = 1;
        mraa_upxtreme_get_pin_index(board,"SPI0_CS1",&board->spi_bus[1].cs);
        mraa_upxtreme_get_pin_index(board,"SPI0_MOSI",&board->spi_bus[1].mosi);
        mraa_upxtreme_get_pin_index(board,"SPI0_MISO",&board->spi_bus[1].miso);
        mraa_upxtreme_get_pin_index(board,"SPI0_CLK",&board->spi_bus[1].sclk);
        board->spi_bus_count = board->spi_bus_count + 1;
        board->uart_dev_count = 0;
        board->def_uart_dev = 0;
        mVar3 = mraa_find_uart_bus_pci
                          ("/sys/bus/pci/devices/0000:00:1e.1/dw-apb-uart.6/tty/",
                           &board->uart_dev[0].device_path);
        if (mVar3 == MRAA_SUCCESS) {
          mraa_upxtreme_get_pin_index(board,"UART_RX",&board->uart_dev[0].rx);
          mraa_upxtreme_get_pin_index(board,"UART_TX",&board->uart_dev[0].tx);
          mraa_upxtreme_get_pin_index(board,"UART_CTS",&board->uart_dev[0].cts);
          mraa_upxtreme_get_pin_index(board,"UART_RTS",&board->uart_dev[0].rts);
          board->uart_dev_count = board->uart_dev_count + 1;
        }
        else {
          syslog(4,"UP Xtreme: Platform failed to find uart controller");
        }
        board->aio_count = 1;
        board->adc_raw = 8;
        board->adc_supported = 8;
        board->aio_non_seq = 1;
        mraa_upxtreme_get_pin_index(board,"ADC0",(int *)board->aio_dev);
        iVar2 = access("/sys/bus/platform/drivers/upboard-pinctrl",0);
        pcVar5 = "";
        if (iVar2 == -1) {
          pcVar5 = "un";
        }
        syslog(5,"UP Xtreme: kernel pinctrl driver %savailable",pcVar5);
        if (iVar2 != -1) {
          return board;
        }
      }
    }
    syslog(2,"UP Xtreme: Platform failed to initialise");
    free(board);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_upxtreme_board()
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof (mraa_board_t));

    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    b->platform_version = PLATFORM_VERSION;
    b->phy_pin_count = MRAA_UPXTREME_PINCOUNT;
    b->gpio_count = MRAA_UPXTREME_GPIOCOUNT;
    b->chardev_capable = 0;

    b->pins = (mraa_pininfo_t*) malloc(sizeof(mraa_pininfo_t) * MRAA_UPXTREME_PINCOUNT);
    if (b->pins == NULL) {
        goto error;
    }

    b->adv_func = (mraa_adv_func_t *) calloc(1, sizeof (mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        goto error;
    }

    b->adv_func->aio_get_valid_fp = &mraa_up_aio_get_valid_fp;

    mraa_upxtreme_set_pininfo(b, 0, "INVALID",    (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 1, "3.3v",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 2, "5v",         (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 3, "I2C_SDA",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 1, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 168, 0, 168);
    mraa_upxtreme_set_pininfo(b, 4, "5v",         (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 5, "I2C_SCL",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 1, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 169, 0, 169);
    mraa_upxtreme_set_pininfo(b, 6, "GND",        (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 7, "ADC0",       (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 1, 0}, MRAA_UPXTREME_CHIP_BASE + 96, 0, 96);
    mraa_upxtreme_set_pininfo(b, 8, "UART_TX",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 1}, MRAA_UPXTREME_CHIP_BASE + 269, 0, 269);
    mraa_upxtreme_set_pininfo(b, 9, "GND",        (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 10, "UART_RX",   (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 1}, MRAA_UPXTREME_CHIP_BASE + 268, 0, 268);
    mraa_upxtreme_set_pininfo(b, 11, "UART_RTS",  (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 1}, MRAA_UPXTREME_CHIP_BASE + 270, 0, 270);
    mraa_upxtreme_set_pininfo(b, 12, "I2S_CLK",   (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 160, 0, 160);
    mraa_upxtreme_set_pininfo(b, 13, "GPIO27",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 68, 0, 68);
    mraa_upxtreme_set_pininfo(b, 14, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 15, "GPIO22",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 70, 0, 70);
    mraa_upxtreme_set_pininfo(b, 16, "GPIO23",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 64, 0, 64);
    mraa_upxtreme_set_pininfo(b, 17, "3.3v",      (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 18, "GPIO24",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 65, 0, 65);
    mraa_upxtreme_set_pininfo(b, 19, "SPI0_MOSI", (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 108, 0, 108);
    mraa_upxtreme_set_pininfo(b, 20, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 21, "SPI0_MISO", (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 107, 0, 107);
    mraa_upxtreme_set_pininfo(b, 22, "GPIO25",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 66, 0, 66);
    mraa_upxtreme_set_pininfo(b, 23, "SPI0_CLK",  (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 106, 0, 106);
    mraa_upxtreme_set_pininfo(b, 24, "SPI0_CS0",  (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 105, 0, 105);
    mraa_upxtreme_set_pininfo(b, 25, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 26, "SPI0_CS1",  (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 111, 0, 111);
    mraa_upxtreme_set_pininfo(b, 27, "ID_SD",     (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 1, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 166, 0, 166);
    mraa_upxtreme_set_pininfo(b, 28, "ID_SC",     (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 1, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 167, 0, 167);
    mraa_upxtreme_set_pininfo(b, 29, "GPIO5",     (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 117, 0, 117);
    mraa_upxtreme_set_pininfo(b, 30, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 31, "GPIO6",     (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 118, 0, 118);
    mraa_upxtreme_set_pininfo(b, 32, "GPIO12",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 98, 0, 98);
    mraa_upxtreme_set_pininfo(b, 33, "GPIO13",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 99, 0, 99);
    mraa_upxtreme_set_pininfo(b, 34, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 35, "I2S_FRM",   (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 161, 0, 161);
    mraa_upxtreme_set_pininfo(b, 36, "UART_CTS",  (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 1}, MRAA_UPXTREME_CHIP_BASE + 271, 0, 271);
    mraa_upxtreme_set_pininfo(b, 37, "GPIO26",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 67, 0, 67);
    mraa_upxtreme_set_pininfo(b, 38, "I2S_DIN",   (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 163, 0, 163);
    mraa_upxtreme_set_pininfo(b, 39, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 40, "I2S_DOUT",  (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 162, 0, 162);

    b->i2c_bus_count = 0;
    b->def_i2c_bus = 0;
    int i2c_bus_num;

    // Configure I2C adaptor #0 (default)
    // (For consistency with Raspberry Pi 2, use I2C1 as our primary I2C bus)
    i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:19.0", "i2c_designware.3");
    if (i2c_bus_num != -1) {
        int i = b->i2c_bus_count;
        b->i2c_bus[i].bus_id = i2c_bus_num;
        mraa_upxtreme_get_pin_index(b, "I2C_SDA", &(b->i2c_bus[i].sda));
        mraa_upxtreme_get_pin_index(b, "I2C_SCL", &(b->i2c_bus[i].scl));
        b->i2c_bus_count++;
    } else {
        syslog(LOG_WARNING, "UP Xtreme: Platform failed to find I2C0 controller");
    }

    // Configure I2C adaptor #1
    // (normally reserved for accessing HAT EEPROM)
    i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:15.3", "i2c_designware.2");
    if (i2c_bus_num != -1) {
        int i = b->i2c_bus_count;
        b->i2c_bus[i].bus_id = i2c_bus_num;
        mraa_upxtreme_get_pin_index(b, "ID_SD", &(b->i2c_bus[i].sda));
        mraa_upxtreme_get_pin_index(b, "ID_SC", &(b->i2c_bus[i].scl));
        b->i2c_bus_count++;
    } else {
        syslog(LOG_WARNING, "UP Xtreme: Platform failed to find I2C1 controller");
    }

    // Configure PWM
    b->pwm_dev_count = 0;

    // Configure SPI
    b->spi_bus_count = 0;
    b->def_spi_bus = 0;

    // Configure SPI #0 CS0 (default)
    b->spi_bus[0].bus_id = 0;
    b->spi_bus[0].slave_s = 0;
    mraa_upxtreme_get_pin_index(b, "SPI0_CS0",  &(b->spi_bus[0].cs));
    mraa_upxtreme_get_pin_index(b, "SPI0_MOSI", &(b->spi_bus[0].mosi));
    mraa_upxtreme_get_pin_index(b, "SPI0_MISO", &(b->spi_bus[0].miso));
    mraa_upxtreme_get_pin_index(b, "SPI0_CLK",  &(b->spi_bus[0].sclk));
    b->spi_bus_count++;

    // Configure SPI #0 CS1
    b->spi_bus[1].bus_id = 0;
    b->spi_bus[1].slave_s = 1;
    mraa_upxtreme_get_pin_index(b, "SPI0_CS1",  &(b->spi_bus[1].cs));
    mraa_upxtreme_get_pin_index(b, "SPI0_MOSI", &(b->spi_bus[1].mosi));
    mraa_upxtreme_get_pin_index(b, "SPI0_MISO", &(b->spi_bus[1].miso));
    mraa_upxtreme_get_pin_index(b, "SPI0_CLK",  &(b->spi_bus[1].sclk));
    b->spi_bus_count++;

    // Configure UART
    b->uart_dev_count = 0;
    b->def_uart_dev = 0;
    // setting up a default path
    if (mraa_find_uart_bus_pci("/sys/bus/pci/devices/0000:00:1e.1/dw-apb-uart.6/tty/",
                               &(b->uart_dev[0].device_path)) != MRAA_SUCCESS) {
        syslog(LOG_WARNING, "UP Xtreme: Platform failed to find uart controller");
    } else {
        // Configure UART #1 (default)
        mraa_upxtreme_get_pin_index(b, "UART_RX", &(b->uart_dev[0].rx));
        mraa_upxtreme_get_pin_index(b, "UART_TX", &(b->uart_dev[0].tx));
        mraa_upxtreme_get_pin_index(b, "UART_CTS", &(b->uart_dev[0].cts));
        mraa_upxtreme_get_pin_index(b, "UART_RTS", &(b->uart_dev[0].rts));
        b->uart_dev_count++;
    }

    // Configure ADC #0
    b->aio_count = 1;
    b->adc_raw = 8;
    b->adc_supported = 8;
    b->aio_non_seq = 1;
    mraa_upxtreme_get_pin_index(b, "ADC0", (int*) &(b->aio_dev[0].pin));

    const char* pinctrl_path = "/sys/bus/platform/drivers/upboard-pinctrl";
    int have_pinctrl = access(pinctrl_path, F_OK) != -1;
    syslog(LOG_NOTICE, "UP Xtreme: kernel pinctrl driver %savailable", have_pinctrl ? "" : "un");

    if (have_pinctrl)
        return b;

error:
    syslog(LOG_CRIT, "UP Xtreme: Platform failed to initialise");
    free(b);
    return NULL;
}